

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O2

void __thiscall
FxMultiNameState::FxMultiNameState(FxMultiNameState *this,char *_statestring,FScriptPosition *pos)

{
  long lVar1;
  TArray<FName,_FName> *other;
  FString statestring;
  FName scopename;
  FString local_30;
  FName local_24;
  FString local_20;
  
  FxExpression::FxExpression(&this->super_FxExpression,pos);
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxMultiNameState_007e9380;
  (this->names).Array = (FName *)0x0;
  (this->names).Most = 0;
  (this->names).Count = 0;
  local_24.Index = 0;
  FString::FString(&local_30,_statestring);
  lVar1 = FString::IndexOf(&local_30,"::",0);
  if ((int)(uint)lVar1 < 0) {
    FName::operator=(&local_24,(char *)0x0);
  }
  else {
    local_24.Index =
         FName::NameManager::FindName
                   (&FName::NameData,local_30.Chars,(ulong)((uint)lVar1 & 0x7fffffff),false);
    FString::Right(&local_20,(size_t)&local_30);
    FString::operator=(&local_30,&local_20);
    FString::~FString(&local_20);
  }
  other = MakeStateNameList(local_30.Chars);
  TArray<FName,_FName>::operator=(&this->names,other);
  TArray<FName,_FName>::Insert(&this->names,0,&local_24);
  this->scope = (PClassActor *)0x0;
  FString::~FString(&local_30);
  return;
}

Assistant:

FxMultiNameState::FxMultiNameState(const char *_statestring, const FScriptPosition &pos)
	:FxExpression(pos)
{
	FName scopename;
	FString statestring = _statestring;
	int scopeindex = statestring.IndexOf("::");

	if (scopeindex >= 0)
	{
		scopename = FName(statestring, scopeindex, false);
		statestring = statestring.Right(statestring.Len() - scopeindex - 2);
	}
	else
	{
		scopename = NULL;
	}
	names = MakeStateNameList(statestring);
	names.Insert(0, scopename);
	scope = NULL;
}